

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_335521::check<bool>(istream *is,bool c)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  char c_1;
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  std::istream::read((char *)is,(long)&local_21);
  __s = _screenWindowCenter + (*_screenWindowCenter == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", got ",6);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((local_21 != '\0') == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = bool]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}